

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_ReplaceChannel(ReplaceChannelForm1 ReplaceChannel)

{
  bool bVar1;
  const_reference pvVar2;
  reference pvVar3;
  code *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> verificationArray;
  uint8_t channelId;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_fffffffffffffeec;
  uint8_t in_stack_fffffffffffffef6;
  uint8_t in_stack_fffffffffffffef7;
  value_type isAnyValue;
  allocator_type *in_stack_fffffffffffffef8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 uVar6;
  Image *in_stack_ffffffffffffff08;
  uchar value;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff10;
  uint32_t in_stack_ffffffffffffff18;
  uint8_t in_stack_ffffffffffffff1f;
  undefined1 local_c9 [32];
  byte local_a9;
  undefined1 local_a8 [96];
  ImageTemplate<unsigned_char> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffeec);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffef8,in_stack_fffffffffffffef7,in_stack_fffffffffffffef6
            );
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18,
             (uint32_t)((ulong)in_stack_ffffffffffffff10 >> 0x20),in_stack_ffffffffffffff08);
  value = (uchar)((ulong)in_stack_ffffffffffffff08 >> 0x38);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1df0fb);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_48);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_48);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffef8,in_stack_fffffffffffffef7,in_stack_fffffffffffffef6
            );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  PenguinV_Image::ImageTemplate<unsigned_char>::fill(in_stack_ffffffffffffff10,value);
  local_a9 = Test_Helper::randomValue<unsigned_char>(0x1df16b);
  (*local_8)(&local_48,local_a8,local_a9);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  pvVar4 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c9;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1df1bd);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (pvVar4,(size_type)pvVar2,
             (value_type_conflict *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1df1e2);
  uVar5 = 0;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  isAnyValue = *pvVar2;
  pvVar4 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_c9 + 1);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (pvVar4,(ulong)local_a9);
  *pvVar3 = isAnyValue;
  bVar1 = Unit_Test::verifyImage
                    ((Image *)CONCAT44(in_stack_ffffffffffffff04,uVar5),pvVar4,(bool)isAnyValue);
  uVar6 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff04);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar6,uVar5));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1df246);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1df253);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar6,uVar5));
  return (bool)((byte)((uint)uVar6 >> 0x18) & 1);
}

Assistant:

bool form1_ReplaceChannel(ReplaceChannelForm1 ReplaceChannel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input = uniformImage( intensity[0] );
        PenguinV_Image::Image output( input.width(), input.height(), PenguinV_Image::RGB );

        output.fill( intensity[1] );

        const uint8_t channelId = randomValue<uint8_t>( 3 );

        ReplaceChannel( input, output, channelId );

        std::vector<uint8_t> verificationArray( 3, intensity[1] );
        verificationArray[channelId] = intensity[0];

        return verifyImage( output, verificationArray, false );
    }